

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O0

int x86SBB(uchar *stream,x86Reg dst,int num)

{
  uchar uVar1;
  uint uVar2;
  uchar *puVar3;
  uchar *start;
  int num_local;
  x86Reg dst_local;
  uchar *stream_local;
  
  uVar2 = encodeRex(stream,false,rNONE,rNONE,dst);
  puVar3 = stream + uVar2;
  if ((char)num == num) {
    *puVar3 = 0x83;
    uVar1 = encodeRegister(dst,'\x03');
    puVar3[1] = uVar1;
    uVar2 = encodeImmByte(puVar3 + 2,(char)num);
    stream_local._4_4_ = ((int)(puVar3 + 2) + uVar2) - (int)stream;
  }
  else {
    *puVar3 = 0x81;
    uVar1 = encodeRegister(dst,'\x03');
    puVar3[1] = uVar1;
    uVar2 = encodeImmDword(puVar3 + 2,num);
    stream_local._4_4_ = ((int)(puVar3 + 2) + uVar2) - (int)stream;
  }
  return stream_local._4_4_;
}

Assistant:

int x86SBB(unsigned char *stream, x86Reg dst, int num)
{
	unsigned char *start = stream;

	stream += encodeRex(stream, false, rNONE, rNONE, dst);

	if((char)num == num)
	{
		*stream++ = 0x83;
		*stream++ = encodeRegister(dst, 3);
		stream += encodeImmByte(stream, (char)num);

		return int(stream - start);
	}

	*stream++ = 0x81;
	*stream++ = encodeRegister(dst, 3);
	stream += encodeImmDword(stream, num);

	return int(stream - start);
}